

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_conversions.hpp
# Opt level: O3

Boxed_Value __thiscall
chaiscript::detail::Static_Caster<TestDerivedType,_TestBaseType>::cast
          (Static_Caster<TestDerivedType,_TestBaseType> *this,Boxed_Value *t_from)

{
  uint uVar1;
  element_type *peVar2;
  undefined8 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  bool bVar7;
  reference_wrapper<TestBaseType> obj;
  reference_wrapper<const_TestBaseType> obj_00;
  undefined8 *puVar8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var9;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  shared_ptr<chaiscript::Boxed_Value::Data> sVar10;
  Boxed_Value BVar11;
  shared_ptr<TestBaseType> local_40;
  Type_Info local_30;
  
  local_30.m_type_info = (type_info *)&TestDerivedType::typeinfo;
  local_30.m_bare_type_info = (type_info *)&TestDerivedType::typeinfo;
  local_30.m_flags = 0;
  bVar7 = Type_Info::bare_equal
                    (&((t_from->m_data).
                       super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr)->m_type_info,&local_30);
  if (!bVar7) {
    puVar8 = (undefined8 *)__cxa_allocate_exception(0x38);
    peVar2 = (t_from->m_data).
             super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    uVar3 = *(undefined8 *)&(peVar2->m_type_info).m_flags;
    uVar4 = *(undefined4 *)((long)&(peVar2->m_type_info).m_type_info + 4);
    uVar5 = *(undefined4 *)&(peVar2->m_type_info).m_bare_type_info;
    uVar6 = *(undefined4 *)((long)&(peVar2->m_type_info).m_bare_type_info + 4);
    *(undefined4 *)(puVar8 + 1) = *(undefined4 *)&(peVar2->m_type_info).m_type_info;
    *(undefined4 *)((long)puVar8 + 0xc) = uVar4;
    *(undefined4 *)(puVar8 + 2) = uVar5;
    *(undefined4 *)((long)puVar8 + 0x14) = uVar6;
    puVar8[3] = uVar3;
    puVar8[4] = &TestBaseType::typeinfo;
    puVar8[5] = 0x1f;
    puVar8[6] = "Unknown dynamic_cast_conversion";
    *puVar8 = &PTR__bad_cast_00175ab0;
    __cxa_throw(puVar8,&chaiscript::exception::bad_boxed_dynamic_cast::typeinfo,
                std::bad_cast::~bad_cast);
  }
  peVar2 = (t_from->m_data).
           super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  uVar1 = (peVar2->m_type_info).m_flags;
  if (peVar2->m_is_ref == false) {
    if ((uVar1 & 1) == 0) {
      Cast_Helper_Inner<std::shared_ptr<TestDerivedType>_>::cast
                ((Boxed_Value *)&local_30,(Type_Conversions_State *)t_from);
      if ((element_type *)local_30.m_type_info == (element_type *)0x0) {
        puVar8 = (undefined8 *)__cxa_allocate_exception(8);
        *puVar8 = __cxa_guard_release;
        __cxa_throw(puVar8,&std::bad_cast::typeinfo,std::bad_cast::~bad_cast);
      }
      local_40.super___shared_ptr<TestBaseType,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)local_30.m_type_info;
      local_40.super___shared_ptr<TestBaseType,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_30.m_bare_type_info;
      sVar10 = Boxed_Value::Object_Data::get<TestBaseType>((Object_Data *)this,&local_40,false);
      _Var9 = sVar10.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi;
    }
    else {
      Cast_Helper_Inner<std::shared_ptr<const_TestDerivedType>_>::cast
                ((Boxed_Value *)&local_30,(Type_Conversions_State *)t_from);
      if ((element_type *)local_30.m_type_info == (element_type *)0x0) {
        puVar8 = (undefined8 *)__cxa_allocate_exception(8);
        *puVar8 = __cxa_guard_release;
        __cxa_throw(puVar8,&std::bad_cast::typeinfo,std::bad_cast::~bad_cast);
      }
      local_40.super___shared_ptr<TestBaseType,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)local_30.m_type_info;
      local_40.super___shared_ptr<TestBaseType,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_30.m_bare_type_info;
      sVar10 = Boxed_Value::Object_Data::get<TestBaseType_const>
                         ((Object_Data *)this,(shared_ptr<const_TestBaseType> *)&local_40,false);
      _Var9 = sVar10.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi;
    }
    if (local_40.super___shared_ptr<TestBaseType,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_40.super___shared_ptr<TestBaseType,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
      _Var9._M_pi = extraout_RDX;
    }
  }
  else if ((uVar1 & 1) == 0) {
    obj._M_data = (TestBaseType *)
                  verify_type<void>((Boxed_Value *)peVar2,(type_info *)&TestDerivedType::typeinfo,
                                    peVar2->m_data_ptr);
    sVar10 = Boxed_Value::Object_Data::get<TestBaseType>((Object_Data *)this,obj,false);
    _Var9 = sVar10.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  }
  else {
    obj_00._M_data =
         (TestBaseType *)
         verify_type<void>((Boxed_Value *)peVar2,(type_info *)&TestDerivedType::typeinfo,
                           peVar2->m_const_data_ptr);
    sVar10 = Boxed_Value::Object_Data::get<TestBaseType_const>((Object_Data *)this,obj_00,false);
    _Var9 = sVar10.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  }
  BVar11.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = _Var9._M_pi;
  BVar11.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)this;
  return (Boxed_Value)
         BVar11.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>
  ;
}

Assistant:

static Boxed_Value cast(const Boxed_Value &t_from) {
        if (t_from.get_type_info().bare_equal(chaiscript::user_type<From>())) {
          if (t_from.is_pointer()) {
            // Dynamic cast out the contained boxed value, which we know is the type we want
            if (t_from.is_const()) {
              return Boxed_Value([&]() {
                if (auto data
                    = std::static_pointer_cast<const To>(detail::Cast_Helper<std::shared_ptr<const From>>::cast(t_from, nullptr))) {
                  return data;
                } else {
                  throw std::bad_cast();
                }
              }());
            } else {
              return Boxed_Value([&]() {
                if (auto data = std::static_pointer_cast<To>(detail::Cast_Helper<std::shared_ptr<From>>::cast(t_from, nullptr))) {
                  return data;
                } else {
                  throw std::bad_cast();
                }
              }());
            }
          } else {
            // Pull the reference out of the contained boxed value, which we know is the type we want
            if (t_from.is_const()) {
              const From &d = detail::Cast_Helper<const From &>::cast(t_from, nullptr);
              const To &data = static_cast<const To &>(d);
              return Boxed_Value(std::cref(data));
            } else {
              From &d = detail::Cast_Helper<From &>::cast(t_from, nullptr);
              To &data = static_cast<To &>(d);
              return Boxed_Value(std::ref(data));
            }
          }
        } else {
          throw chaiscript::exception::bad_boxed_dynamic_cast(t_from.get_type_info(), typeid(To), "Unknown dynamic_cast_conversion");
        }
      }